

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O0

void plutovg_matrix_map_rect(plutovg_matrix_t *matrix,plutovg_rect_t *src,plutovg_rect_t *dst)

{
  int local_5c;
  float local_58;
  int i;
  float b;
  float r;
  float t;
  float l;
  plutovg_point_t p [4];
  plutovg_rect_t *dst_local;
  plutovg_rect_t *src_local;
  plutovg_matrix_t *matrix_local;
  
  t = src->x;
  l = src->y;
  p[0].x = src->x + src->w;
  p[0].y = src->y;
  p[1].x = src->x + src->w;
  p[1].y = src->y + src->h;
  p[2].x = src->x;
  p[2].y = src->y + src->h;
  plutovg_matrix_map_points(matrix,(plutovg_point_t *)&t,(plutovg_point_t *)&t,4);
  r = t;
  b = l;
  i = (int)t;
  local_58 = l;
  for (local_5c = 1; local_5c < 4; local_5c = local_5c + 1) {
    if ((&t)[(long)local_5c * 2] < r) {
      r = (&t)[(long)local_5c * 2];
    }
    if ((float)i < (&t)[(long)local_5c * 2]) {
      i = (int)(&t)[(long)local_5c * 2];
    }
    if (p[(long)local_5c + -1].y < b) {
      b = p[(long)local_5c + -1].y;
    }
    if (local_58 < p[(long)local_5c + -1].y) {
      local_58 = p[(long)local_5c + -1].y;
    }
  }
  dst->x = r;
  dst->y = b;
  dst->w = (float)i - r;
  dst->h = local_58 - b;
  return;
}

Assistant:

void plutovg_matrix_map_rect(const plutovg_matrix_t* matrix, const plutovg_rect_t* src, plutovg_rect_t* dst)
{
    plutovg_point_t p[4];
    p[0].x = src->x;
    p[0].y = src->y;
    p[1].x = src->x + src->w;
    p[1].y = src->y;
    p[2].x = src->x + src->w;
    p[2].y = src->y + src->h;
    p[3].x = src->x;
    p[3].y = src->y + src->h;
    plutovg_matrix_map_points(matrix, p, p, 4);

    float l = p[0].x;
    float t = p[0].y;
    float r = p[0].x;
    float b = p[0].y;

    for(int i = 1; i < 4; i++) {
        if(p[i].x < l) l = p[i].x;
        if(p[i].x > r) r = p[i].x;
        if(p[i].y < t) t = p[i].y;
        if(p[i].y > b) b = p[i].y;
    }

    dst->x = l;
    dst->y = t;
    dst->w = r - l;
    dst->h = b - t;
}